

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedcheck.c
# Opt level: O2

CURLcode Curl_speedcheck(Curl_easy *data,curltime now)

{
  long lVar1;
  timediff_t tVar2;
  curltime older;
  curltime newer;
  
  if (((data->req).keepon & 0x10) == 0) {
    lVar1 = (data->progress).current_speed;
    if ((-1 < lVar1) && ((data->set).low_speed_time != 0)) {
      if (lVar1 < (data->set).low_speed_limit) {
        lVar1 = (data->state).keeps_speed.tv_sec;
        if (lVar1 == 0) {
          (data->state).keeps_speed.tv_sec = now.tv_sec;
          (data->state).keeps_speed.tv_usec = now.tv_usec;
        }
        else {
          newer._8_8_ = now._8_8_ & 0xffffffff;
          older.tv_usec = (data->state).keeps_speed.tv_usec;
          older.tv_sec = lVar1;
          older._12_4_ = 0;
          newer.tv_sec = now.tv_sec;
          tVar2 = Curl_timediff(newer,older);
          if ((data->set).low_speed_time * 1000 <= tVar2) {
            Curl_failf(data,
                       "Operation too slow. Less than %ld bytes/sec transferred the last %ld seconds"
                       ,(data->set).low_speed_limit);
            return CURLE_OPERATION_TIMEDOUT;
          }
        }
      }
      else {
        (data->state).keeps_speed.tv_sec = 0;
      }
    }
    if ((data->set).low_speed_limit != 0) {
      Curl_expire(data,1000,EXPIRE_SPEEDCHECK);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_speedcheck(struct Curl_easy *data,
                         struct curltime now)
{
  if(data->req.keepon & KEEP_RECV_PAUSE)
    /* A paused transfer is not qualified for speed checks */
    return CURLE_OK;

  if((data->progress.current_speed >= 0) && data->set.low_speed_time) {
    if(data->progress.current_speed < data->set.low_speed_limit) {
      if(!data->state.keeps_speed.tv_sec)
        /* under the limit at this very moment */
        data->state.keeps_speed = now;
      else {
        /* how long has it been under the limit */
        timediff_t howlong = Curl_timediff(now, data->state.keeps_speed);

        if(howlong >= data->set.low_speed_time * 1000) {
          /* too long */
          failf(data,
                "Operation too slow. "
                "Less than %ld bytes/sec transferred the last %ld seconds",
                data->set.low_speed_limit,
                data->set.low_speed_time);
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
    }
    else
      /* faster right now */
      data->state.keeps_speed.tv_sec = 0;
  }

  if(data->set.low_speed_limit)
    /* if low speed limit is enabled, set the expire timer to make this
       connection's speed get checked again in a second */
    Curl_expire(data, 1000, EXPIRE_SPEEDCHECK);

  return CURLE_OK;
}